

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Scene *pSVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  float fVar46;
  float fVar55;
  float fVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  float fVar58;
  float fVar63;
  float fVar64;
  undefined1 auVar59 [16];
  float fVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  float fVar81;
  float fVar90;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar88;
  float fVar89;
  undefined1 auVar87 [64];
  float fVar91;
  undefined1 auVar92 [16];
  float fVar100;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar98;
  float fVar99;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [64];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar126 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1549;
  undefined8 local_1548;
  float fStack_1540;
  float fStack_153c;
  RayQueryContext *local_1538;
  int local_152c;
  undefined1 local_1528 [16];
  undefined1 local_1518 [8];
  float fStack_1510;
  float fStack_150c;
  undefined8 local_1508;
  float fStack_1500;
  float fStack_14fc;
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  long local_1498;
  long local_1490;
  undefined4 local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 local_1478;
  undefined4 local_1474;
  uint local_1470;
  uint local_146c;
  uint local_1468;
  RTCFilterFunctionNArguments local_1458;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar28 = ray->tfar;
    if (0.0 <= fVar28) {
      puVar17 = local_11d0;
      aVar2 = (ray->dir).field_0;
      auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx((undefined1  [16])aVar2,auVar75);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar66,1);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar66 = vdivps_avx(auVar67,(undefined1  [16])aVar2);
      auVar68._8_4_ = 0x5d5e0b6b;
      auVar68._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar68._12_4_ = 0x5d5e0b6b;
      auVar75 = vblendvps_avx(auVar66,auVar68,auVar75);
      auVar59._0_4_ = auVar75._0_4_ * 0.99999964;
      auVar59._4_4_ = auVar75._4_4_ * 0.99999964;
      auVar59._8_4_ = auVar75._8_4_ * 0.99999964;
      auVar59._12_4_ = auVar75._12_4_ * 0.99999964;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      auVar87 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar97 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar103 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(
                                                  uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
      auVar47._0_4_ = auVar75._0_4_ * 1.0000004;
      auVar47._4_4_ = auVar75._4_4_ * 1.0000004;
      auVar47._8_4_ = auVar75._8_4_ * 1.0000004;
      auVar47._12_4_ = auVar75._12_4_ * 1.0000004;
      auVar75 = vshufps_avx(auVar59,auVar59,0);
      auVar105 = ZEXT3264(CONCAT1616(auVar75,auVar75));
      auVar75 = vmovshdup_avx(auVar59);
      auVar66 = vshufps_avx(auVar59,auVar59,0x55);
      auVar109 = ZEXT3264(CONCAT1616(auVar66,auVar66));
      auVar66 = vshufpd_avx(auVar59,auVar59,1);
      auVar67 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar112 = ZEXT3264(CONCAT1616(auVar67,auVar67));
      auVar67 = vshufps_avx(auVar47,auVar47,0);
      auVar120 = ZEXT3264(CONCAT1616(auVar67,auVar67));
      uVar18 = (ulong)(auVar59._0_4_ < 0.0) << 5;
      auVar67 = vshufps_avx(auVar47,auVar47,0x55);
      auVar62 = ZEXT3264(CONCAT1616(auVar67,auVar67));
      auVar67 = vshufps_avx(auVar47,auVar47,0xaa);
      uVar15 = (ulong)(auVar75._0_4_ < 0.0) << 5 | 0x40;
      auVar54 = ZEXT3264(CONCAT1616(auVar67,auVar67));
      uVar19 = (ulong)(auVar66._0_4_ < 0.0) << 5 | 0x80;
      uVar20 = uVar18 ^ 0x20;
      auVar75 = vshufps_avx(auVar30,auVar30,0);
      auVar76 = ZEXT3264(CONCAT1616(auVar75,auVar75));
      auVar75 = vshufps_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),0);
      auVar80 = ZEXT3264(CONCAT1616(auVar75,auVar75));
      local_1428 = mm_lookupmask_ps._240_16_;
      local_1538 = context;
      do {
        uVar21 = puVar17[-1];
        puVar17 = puVar17 + -1;
        local_11f8 = auVar87._0_32_;
        local_1218 = auVar97._0_32_;
        local_1238 = auVar103._0_32_;
        while ((uVar21 & 8) == 0) {
          auVar4 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar18),local_11f8);
          auVar5._4_4_ = auVar105._4_4_ * auVar4._4_4_;
          auVar5._0_4_ = auVar105._0_4_ * auVar4._0_4_;
          auVar5._8_4_ = auVar105._8_4_ * auVar4._8_4_;
          auVar5._12_4_ = auVar105._12_4_ * auVar4._12_4_;
          auVar5._16_4_ = auVar105._16_4_ * auVar4._16_4_;
          auVar5._20_4_ = auVar105._20_4_ * auVar4._20_4_;
          auVar5._24_4_ = auVar105._24_4_ * auVar4._24_4_;
          auVar5._28_4_ = auVar4._28_4_;
          auVar4 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar15),local_1218);
          auVar6._4_4_ = auVar109._4_4_ * auVar4._4_4_;
          auVar6._0_4_ = auVar109._0_4_ * auVar4._0_4_;
          auVar6._8_4_ = auVar109._8_4_ * auVar4._8_4_;
          auVar6._12_4_ = auVar109._12_4_ * auVar4._12_4_;
          auVar6._16_4_ = auVar109._16_4_ * auVar4._16_4_;
          auVar6._20_4_ = auVar109._20_4_ * auVar4._20_4_;
          auVar6._24_4_ = auVar109._24_4_ * auVar4._24_4_;
          auVar6._28_4_ = auVar4._28_4_;
          auVar4 = vmaxps_avx(auVar5,auVar6);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar19),local_1238);
          auVar7._4_4_ = auVar112._4_4_ * auVar5._4_4_;
          auVar7._0_4_ = auVar112._0_4_ * auVar5._0_4_;
          auVar7._8_4_ = auVar112._8_4_ * auVar5._8_4_;
          auVar7._12_4_ = auVar112._12_4_ * auVar5._12_4_;
          auVar7._16_4_ = auVar112._16_4_ * auVar5._16_4_;
          auVar7._20_4_ = auVar112._20_4_ * auVar5._20_4_;
          auVar7._24_4_ = auVar112._24_4_ * auVar5._24_4_;
          auVar7._28_4_ = auVar5._28_4_;
          auVar5 = vmaxps_avx(auVar7,auVar76._0_32_);
          auVar4 = vmaxps_avx(auVar4,auVar5);
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + uVar20),local_11f8);
          auVar8._4_4_ = auVar120._4_4_ * auVar5._4_4_;
          auVar8._0_4_ = auVar120._0_4_ * auVar5._0_4_;
          auVar8._8_4_ = auVar120._8_4_ * auVar5._8_4_;
          auVar8._12_4_ = auVar120._12_4_ * auVar5._12_4_;
          auVar8._16_4_ = auVar120._16_4_ * auVar5._16_4_;
          auVar8._20_4_ = auVar120._20_4_ * auVar5._20_4_;
          auVar8._24_4_ = auVar120._24_4_ * auVar5._24_4_;
          auVar8._28_4_ = auVar5._28_4_;
          auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar15 ^ 0x20)),local_1218);
          auVar9._4_4_ = auVar62._4_4_ * auVar5._4_4_;
          auVar9._0_4_ = auVar62._0_4_ * auVar5._0_4_;
          auVar9._8_4_ = auVar62._8_4_ * auVar5._8_4_;
          auVar9._12_4_ = auVar62._12_4_ * auVar5._12_4_;
          auVar9._16_4_ = auVar62._16_4_ * auVar5._16_4_;
          auVar9._20_4_ = auVar62._20_4_ * auVar5._20_4_;
          auVar9._24_4_ = auVar62._24_4_ * auVar5._24_4_;
          auVar9._28_4_ = auVar5._28_4_;
          auVar5 = vminps_avx(auVar8,auVar9);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar21 + 0x40 + (uVar19 ^ 0x20)),local_1238);
          auVar10._4_4_ = auVar54._4_4_ * auVar6._4_4_;
          auVar10._0_4_ = auVar54._0_4_ * auVar6._0_4_;
          auVar10._8_4_ = auVar54._8_4_ * auVar6._8_4_;
          auVar10._12_4_ = auVar54._12_4_ * auVar6._12_4_;
          auVar10._16_4_ = auVar54._16_4_ * auVar6._16_4_;
          auVar10._20_4_ = auVar54._20_4_ * auVar6._20_4_;
          auVar10._24_4_ = auVar54._24_4_ * auVar6._24_4_;
          auVar10._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar10,auVar80._0_32_);
          auVar5 = vminps_avx(auVar5,auVar6);
          auVar4 = vcmpps_avx(auVar4,auVar5,2);
          uVar12 = vmovmskps_avx(auVar4);
          if (uVar12 == 0) goto LAB_002e5083;
          uVar12 = uVar12 & 0xff;
          uVar11 = uVar21 & 0xfffffffffffffff0;
          lVar14 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar21 = *(ulong *)(uVar11 + lVar14 * 8);
          uVar12 = uVar12 - 1 & uVar12;
          if (uVar12 != 0) {
            *puVar17 = uVar21;
            puVar17 = puVar17 + 1;
            lVar14 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            uVar21 = *(ulong *)(uVar11 + lVar14 * 8);
            uVar12 = uVar12 - 1 & uVar12;
            uVar13 = (ulong)uVar12;
            if (uVar12 != 0) {
              do {
                *puVar17 = uVar21;
                puVar17 = puVar17 + 1;
                lVar14 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar21 = *(ulong *)(uVar11 + lVar14 * 8);
                uVar13 = uVar13 & uVar13 - 1;
              } while (uVar13 != 0);
            }
          }
        }
        local_1498 = (ulong)((uint)uVar21 & 0xf) - 8;
        if (local_1498 != 0) {
          uVar21 = uVar21 & 0xfffffffffffffff0;
          local_1490 = 0;
          local_1258 = auVar105._0_32_;
          local_1278 = auVar109._0_32_;
          local_1298 = auVar112._0_32_;
          local_12b8 = auVar120._0_32_;
          local_12d8 = auVar62._0_32_;
          local_12f8 = auVar54._0_32_;
          local_1318 = auVar76._0_32_;
          local_1338 = auVar80._0_32_;
          do {
            lVar14 = local_1490 * 0xb0;
            uVar1 = *(undefined4 *)&(ray->org).field_0;
            auVar22._4_4_ = uVar1;
            auVar22._0_4_ = uVar1;
            auVar22._8_4_ = uVar1;
            auVar22._12_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar39._4_4_ = uVar1;
            auVar39._0_4_ = uVar1;
            auVar39._8_4_ = uVar1;
            auVar39._12_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar48._4_4_ = uVar1;
            auVar48._0_4_ = uVar1;
            auVar48._8_4_ = uVar1;
            auVar48._12_4_ = uVar1;
            local_14e8 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + lVar14),auVar22);
            local_14f8 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x10 + lVar14),auVar39);
            local_14a8 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + lVar14),auVar48);
            auVar75 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x30 + lVar14),auVar22);
            auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x40 + lVar14),auVar39);
            auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x50 + lVar14),auVar48);
            auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x60 + lVar14),auVar22);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x70 + lVar14),auVar39);
            auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x80 + lVar14),auVar48);
            local_14b8 = vsubps_avx(auVar67,local_14e8);
            local_14c8 = vsubps_avx(auVar47,local_14f8);
            local_14d8 = vsubps_avx(auVar59,local_14a8);
            fVar124 = local_14f8._0_4_;
            fVar28 = fVar124 + auVar47._0_4_;
            fVar127 = local_14f8._4_4_;
            fVar36 = fVar127 + auVar47._4_4_;
            fVar129 = local_14f8._8_4_;
            fVar37 = fVar129 + auVar47._8_4_;
            fVar131 = local_14f8._12_4_;
            fVar38 = fVar131 + auVar47._12_4_;
            fVar104 = local_14a8._0_4_;
            fVar58 = fVar104 + auVar59._0_4_;
            fVar106 = local_14a8._4_4_;
            fVar63 = fVar106 + auVar59._4_4_;
            fVar107 = local_14a8._8_4_;
            fVar64 = fVar107 + auVar59._8_4_;
            fVar108 = local_14a8._12_4_;
            fVar65 = fVar108 + auVar59._12_4_;
            fVar45 = local_14d8._0_4_;
            auVar92._0_4_ = fVar28 * fVar45;
            fVar55 = local_14d8._4_4_;
            auVar92._4_4_ = fVar36 * fVar55;
            fVar56 = local_14d8._8_4_;
            auVar92._8_4_ = fVar37 * fVar56;
            fVar46 = local_14d8._12_4_;
            auVar92._12_4_ = fVar38 * fVar46;
            fVar133 = local_14c8._0_4_;
            auVar101._0_4_ = fVar133 * fVar58;
            fVar136 = local_14c8._4_4_;
            auVar101._4_4_ = fVar136 * fVar63;
            fVar139 = local_14c8._8_4_;
            auVar101._8_4_ = fVar139 * fVar64;
            fVar142 = local_14c8._12_4_;
            auVar101._12_4_ = fVar142 * fVar65;
            auVar68 = vsubps_avx(auVar101,auVar92);
            fVar81 = local_14e8._0_4_;
            fVar91 = fVar81 + auVar67._0_4_;
            fVar88 = local_14e8._4_4_;
            fVar98 = fVar88 + auVar67._4_4_;
            fVar89 = local_14e8._8_4_;
            fVar99 = fVar89 + auVar67._8_4_;
            fVar90 = local_14e8._12_4_;
            fVar100 = fVar90 + auVar67._12_4_;
            fVar119 = local_14b8._0_4_;
            auVar60._0_4_ = fVar119 * fVar58;
            fVar121 = local_14b8._4_4_;
            auVar60._4_4_ = fVar121 * fVar63;
            fVar122 = local_14b8._8_4_;
            auVar60._8_4_ = fVar122 * fVar64;
            fVar123 = local_14b8._12_4_;
            auVar60._12_4_ = fVar123 * fVar65;
            auVar102._0_4_ = fVar91 * fVar45;
            auVar102._4_4_ = fVar98 * fVar55;
            auVar102._8_4_ = fVar99 * fVar56;
            auVar102._12_4_ = fVar100 * fVar46;
            auVar22 = vsubps_avx(auVar102,auVar60);
            auVar93._0_4_ = fVar91 * fVar133;
            auVar93._4_4_ = fVar98 * fVar136;
            auVar93._8_4_ = fVar99 * fVar139;
            auVar93._12_4_ = fVar100 * fVar142;
            auVar23._0_4_ = fVar119 * fVar28;
            auVar23._4_4_ = fVar121 * fVar36;
            auVar23._8_4_ = fVar122 * fVar37;
            auVar23._12_4_ = fVar123 * fVar38;
            auVar23 = vsubps_avx(auVar23,auVar93);
            fVar28 = (ray->dir).field_0.m128[2];
            local_1548._4_4_ = (ray->dir).field_0.m128[1];
            local_1508._4_4_ = (ray->dir).field_0.m128[0];
            local_1528._0_4_ =
                 local_1508._4_4_ * auVar68._0_4_ +
                 fVar28 * auVar23._0_4_ + local_1548._4_4_ * auVar22._0_4_;
            local_1528._4_4_ =
                 local_1508._4_4_ * auVar68._4_4_ +
                 fVar28 * auVar23._4_4_ + local_1548._4_4_ * auVar22._4_4_;
            local_1528._8_4_ =
                 local_1508._4_4_ * auVar68._8_4_ +
                 fVar28 * auVar23._8_4_ + local_1548._4_4_ * auVar22._8_4_;
            local_1528._12_4_ =
                 local_1508._4_4_ * auVar68._12_4_ +
                 fVar28 * auVar23._12_4_ + local_1548._4_4_ * auVar22._12_4_;
            local_13f8 = vsubps_avx(local_14f8,auVar66);
            local_1408 = vsubps_avx(local_14a8,auVar30);
            fVar36 = fVar124 + auVar66._0_4_;
            fVar37 = fVar127 + auVar66._4_4_;
            fVar38 = fVar129 + auVar66._8_4_;
            fVar58 = fVar131 + auVar66._12_4_;
            fVar63 = fVar104 + auVar30._0_4_;
            fVar64 = fVar106 + auVar30._4_4_;
            fVar65 = fVar107 + auVar30._8_4_;
            fVar91 = fVar108 + auVar30._12_4_;
            fVar110 = local_1408._0_4_;
            auVar29._0_4_ = fVar110 * fVar36;
            fVar113 = local_1408._4_4_;
            auVar29._4_4_ = fVar113 * fVar37;
            fVar115 = local_1408._8_4_;
            auVar29._8_4_ = fVar115 * fVar38;
            fVar117 = local_1408._12_4_;
            auVar29._12_4_ = fVar117 * fVar58;
            fVar134 = local_13f8._0_4_;
            auVar126._0_4_ = fVar134 * fVar63;
            fVar137 = local_13f8._4_4_;
            auVar126._4_4_ = fVar137 * fVar64;
            fVar140 = local_13f8._8_4_;
            auVar126._8_4_ = fVar140 * fVar65;
            fVar143 = local_13f8._12_4_;
            auVar126._12_4_ = fVar143 * fVar91;
            auVar68 = vsubps_avx(auVar126,auVar29);
            auVar22 = vsubps_avx(local_14e8,auVar75);
            fVar125 = auVar22._0_4_;
            auVar61._0_4_ = fVar125 * fVar63;
            fVar128 = auVar22._4_4_;
            auVar61._4_4_ = fVar128 * fVar64;
            fVar130 = auVar22._8_4_;
            auVar61._8_4_ = fVar130 * fVar65;
            fVar132 = auVar22._12_4_;
            auVar61._12_4_ = fVar132 * fVar91;
            fVar63 = fVar81 + auVar75._0_4_;
            fVar64 = fVar88 + auVar75._4_4_;
            fVar65 = fVar89 + auVar75._8_4_;
            fVar91 = fVar90 + auVar75._12_4_;
            auVar94._0_4_ = fVar110 * fVar63;
            auVar94._4_4_ = fVar113 * fVar64;
            auVar94._8_4_ = fVar115 * fVar65;
            auVar94._12_4_ = fVar117 * fVar91;
            auVar22 = vsubps_avx(auVar94,auVar61);
            auVar95._8_4_ = 0x7fffffff;
            auVar95._0_8_ = 0x7fffffff7fffffff;
            auVar95._12_4_ = 0x7fffffff;
            auVar82._0_4_ = fVar134 * fVar63;
            auVar82._4_4_ = fVar137 * fVar64;
            auVar82._8_4_ = fVar140 * fVar65;
            auVar82._12_4_ = fVar143 * fVar91;
            auVar24._0_4_ = fVar125 * fVar36;
            auVar24._4_4_ = fVar128 * fVar37;
            auVar24._8_4_ = fVar130 * fVar38;
            auVar24._12_4_ = fVar132 * fVar58;
            auVar23 = vsubps_avx(auVar24,auVar82);
            local_1518._0_4_ = auVar68._0_4_;
            local_1518._4_4_ = auVar68._4_4_;
            fStack_1510 = auVar68._8_4_;
            fStack_150c = auVar68._12_4_;
            local_13d8._0_4_ =
                 local_1508._4_4_ * (float)local_1518._0_4_ +
                 fVar28 * auVar23._0_4_ + local_1548._4_4_ * auVar22._0_4_;
            local_13d8._4_4_ =
                 local_1508._4_4_ * (float)local_1518._4_4_ +
                 fVar28 * auVar23._4_4_ + local_1548._4_4_ * auVar22._4_4_;
            local_13d8._8_4_ =
                 local_1508._4_4_ * fStack_1510 +
                 fVar28 * auVar23._8_4_ + local_1548._4_4_ * auVar22._8_4_;
            local_13d8._12_4_ =
                 local_1508._4_4_ * fStack_150c +
                 fVar28 * auVar23._12_4_ + local_1548._4_4_ * auVar22._12_4_;
            auVar68 = vsubps_avx(auVar75,auVar67);
            fVar63 = auVar75._0_4_ + auVar67._0_4_;
            fVar64 = auVar75._4_4_ + auVar67._4_4_;
            fVar65 = auVar75._8_4_ + auVar67._8_4_;
            fVar91 = auVar75._12_4_ + auVar67._12_4_;
            auVar75 = vsubps_avx(auVar66,auVar47);
            fVar98 = auVar66._0_4_ + auVar47._0_4_;
            fVar99 = auVar66._4_4_ + auVar47._4_4_;
            fVar100 = auVar66._8_4_ + auVar47._8_4_;
            fVar44 = auVar66._12_4_ + auVar47._12_4_;
            auVar66 = vsubps_avx(auVar30,auVar59);
            fVar37 = auVar30._0_4_ + auVar59._0_4_;
            fVar38 = auVar30._4_4_ + auVar59._4_4_;
            fVar58 = auVar30._8_4_ + auVar59._8_4_;
            fVar57 = auVar30._12_4_ + auVar59._12_4_;
            fVar135 = auVar66._0_4_;
            auVar69._0_4_ = fVar135 * fVar98;
            fVar138 = auVar66._4_4_;
            auVar69._4_4_ = fVar138 * fVar99;
            fVar141 = auVar66._8_4_;
            auVar69._8_4_ = fVar141 * fVar100;
            fVar144 = auVar66._12_4_;
            auVar69._12_4_ = fVar144 * fVar44;
            fVar111 = auVar75._0_4_;
            auVar83._0_4_ = fVar111 * fVar37;
            fVar114 = auVar75._4_4_;
            auVar83._4_4_ = fVar114 * fVar38;
            fVar116 = auVar75._8_4_;
            auVar83._8_4_ = fVar116 * fVar58;
            fVar118 = auVar75._12_4_;
            auVar83._12_4_ = fVar118 * fVar57;
            auVar75 = vsubps_avx(auVar83,auVar69);
            fVar36 = auVar68._0_4_;
            auVar49._0_4_ = fVar36 * fVar37;
            fVar37 = auVar68._4_4_;
            auVar49._4_4_ = fVar37 * fVar38;
            fVar38 = auVar68._8_4_;
            auVar49._8_4_ = fVar38 * fVar58;
            fVar58 = auVar68._12_4_;
            auVar49._12_4_ = fVar58 * fVar57;
            auVar84._0_4_ = fVar135 * fVar63;
            auVar84._4_4_ = fVar138 * fVar64;
            auVar84._8_4_ = fVar141 * fVar65;
            auVar84._12_4_ = fVar144 * fVar91;
            auVar66 = vsubps_avx(auVar84,auVar49);
            auVar30._0_4_ = fVar111 * fVar63;
            auVar30._4_4_ = fVar114 * fVar64;
            auVar30._8_4_ = fVar116 * fVar65;
            auVar30._12_4_ = fVar118 * fVar91;
            auVar40._0_4_ = fVar36 * fVar98;
            auVar40._4_4_ = fVar37 * fVar99;
            auVar40._8_4_ = fVar38 * fVar100;
            auVar40._12_4_ = fVar58 * fVar44;
            auVar30 = vsubps_avx(auVar40,auVar30);
            local_1548._0_4_ = local_1548._4_4_;
            fStack_1540 = local_1548._4_4_;
            fStack_153c = local_1548._4_4_;
            local_1508._0_4_ = local_1508._4_4_;
            fStack_1500 = local_1508._4_4_;
            fStack_14fc = local_1508._4_4_;
            auVar31._0_4_ =
                 local_1508._4_4_ * auVar75._0_4_ +
                 fVar28 * auVar30._0_4_ + local_1548._4_4_ * auVar66._0_4_;
            auVar31._4_4_ =
                 local_1508._4_4_ * auVar75._4_4_ +
                 fVar28 * auVar30._4_4_ + local_1548._4_4_ * auVar66._4_4_;
            auVar31._8_4_ =
                 local_1508._4_4_ * auVar75._8_4_ +
                 fVar28 * auVar30._8_4_ + local_1548._4_4_ * auVar66._8_4_;
            auVar31._12_4_ =
                 local_1508._4_4_ * auVar75._12_4_ +
                 fVar28 * auVar30._12_4_ + local_1548._4_4_ * auVar66._12_4_;
            local_13c8._0_4_ = auVar31._0_4_ + local_1528._0_4_ + local_13d8._0_4_;
            local_13c8._4_4_ = auVar31._4_4_ + local_1528._4_4_ + local_13d8._4_4_;
            local_13c8._8_4_ = auVar31._8_4_ + local_1528._8_4_ + local_13d8._8_4_;
            local_13c8._12_4_ = auVar31._12_4_ + local_1528._12_4_ + local_13d8._12_4_;
            auVar75 = vminps_avx(local_1528,local_13d8);
            auVar75 = vminps_avx(auVar75,auVar31);
            _local_1518 = vandps_avx(local_13c8,auVar95);
            auVar50._0_4_ = local_1518._0_4_ * 1.1920929e-07;
            auVar50._4_4_ = local_1518._4_4_ * 1.1920929e-07;
            auVar50._8_4_ = local_1518._8_4_ * 1.1920929e-07;
            auVar50._12_4_ = local_1518._12_4_ * 1.1920929e-07;
            uVar11 = CONCAT44(auVar50._4_4_,auVar50._0_4_);
            auVar70._0_8_ = uVar11 ^ 0x8000000080000000;
            auVar70._8_4_ = -auVar50._8_4_;
            auVar70._12_4_ = -auVar50._12_4_;
            auVar75 = vcmpps_avx(auVar75,auVar70,5);
            auVar66 = vmaxps_avx(local_1528,local_13d8);
            auVar66 = vmaxps_avx(auVar66,auVar31);
            auVar66 = vcmpps_avx(auVar66,auVar50,2);
            local_1418 = vorps_avx(auVar75,auVar66);
            auVar75 = local_1428 & local_1418;
            if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar75[0xf] < '\0') {
              auVar32._0_4_ = fVar134 * fVar45;
              auVar32._4_4_ = fVar137 * fVar55;
              auVar32._8_4_ = fVar140 * fVar56;
              auVar32._12_4_ = fVar143 * fVar46;
              auVar41._0_4_ = fVar133 * fVar110;
              auVar41._4_4_ = fVar136 * fVar113;
              auVar41._8_4_ = fVar139 * fVar115;
              auVar41._12_4_ = fVar142 * fVar117;
              auVar30 = vsubps_avx(auVar41,auVar32);
              auVar51._0_4_ = fVar111 * fVar110;
              auVar51._4_4_ = fVar114 * fVar113;
              auVar51._8_4_ = fVar116 * fVar115;
              auVar51._12_4_ = fVar118 * fVar117;
              auVar71._0_4_ = fVar134 * fVar135;
              auVar71._4_4_ = fVar137 * fVar138;
              auVar71._8_4_ = fVar140 * fVar141;
              auVar71._12_4_ = fVar143 * fVar144;
              auVar67 = vsubps_avx(auVar71,auVar51);
              auVar75 = vandps_avx(auVar95,auVar32);
              auVar66 = vandps_avx(auVar95,auVar51);
              auVar75 = vcmpps_avx(auVar75,auVar66,1);
              local_1368 = vblendvps_avx(auVar67,auVar30,auVar75);
              auVar42._0_4_ = fVar125 * fVar135;
              auVar42._4_4_ = fVar128 * fVar138;
              auVar42._8_4_ = fVar130 * fVar141;
              auVar42._12_4_ = fVar132 * fVar144;
              auVar52._0_4_ = fVar125 * fVar45;
              auVar52._4_4_ = fVar128 * fVar55;
              auVar52._8_4_ = fVar130 * fVar56;
              auVar52._12_4_ = fVar132 * fVar46;
              auVar72._0_4_ = fVar110 * fVar119;
              auVar72._4_4_ = fVar113 * fVar121;
              auVar72._8_4_ = fVar115 * fVar122;
              auVar72._12_4_ = fVar117 * fVar123;
              auVar30 = vsubps_avx(auVar52,auVar72);
              auVar77._0_4_ = fVar110 * fVar36;
              auVar77._4_4_ = fVar113 * fVar37;
              auVar77._8_4_ = fVar115 * fVar38;
              auVar77._12_4_ = fVar117 * fVar58;
              auVar67 = vsubps_avx(auVar77,auVar42);
              auVar75 = vandps_avx(auVar95,auVar72);
              auVar66 = vandps_avx(auVar95,auVar42);
              auVar75 = vcmpps_avx(auVar75,auVar66,1);
              local_1358 = vblendvps_avx(auVar67,auVar30,auVar75);
              auVar25._0_4_ = fVar134 * fVar36;
              auVar25._4_4_ = fVar137 * fVar37;
              auVar25._8_4_ = fVar140 * fVar38;
              auVar25._12_4_ = fVar143 * fVar58;
              auVar53._0_4_ = fVar134 * fVar119;
              auVar53._4_4_ = fVar137 * fVar121;
              auVar53._8_4_ = fVar140 * fVar122;
              auVar53._12_4_ = fVar143 * fVar123;
              auVar73._0_4_ = fVar125 * fVar133;
              auVar73._4_4_ = fVar128 * fVar136;
              auVar73._8_4_ = fVar130 * fVar139;
              auVar73._12_4_ = fVar132 * fVar142;
              auVar78._0_4_ = fVar125 * fVar111;
              auVar78._4_4_ = fVar128 * fVar114;
              auVar78._8_4_ = fVar130 * fVar116;
              auVar78._12_4_ = fVar132 * fVar118;
              auVar30 = vsubps_avx(auVar53,auVar73);
              auVar67 = vsubps_avx(auVar78,auVar25);
              auVar75 = vandps_avx(auVar95,auVar73);
              auVar66 = vandps_avx(auVar95,auVar25);
              auVar75 = vcmpps_avx(auVar75,auVar66,1);
              local_1348 = vblendvps_avx(auVar67,auVar30,auVar75);
              fVar45 = local_1368._0_4_ * local_1508._4_4_ +
                       fVar28 * local_1348._0_4_ + local_1358._0_4_ * local_1548._4_4_;
              fVar55 = local_1368._4_4_ * local_1508._4_4_ +
                       fVar28 * local_1348._4_4_ + local_1358._4_4_ * local_1548._4_4_;
              fVar56 = local_1368._8_4_ * local_1508._4_4_ +
                       fVar28 * local_1348._8_4_ + local_1358._8_4_ * local_1548._4_4_;
              fVar28 = local_1368._12_4_ * local_1508._4_4_ +
                       fVar28 * local_1348._12_4_ + local_1358._12_4_ * local_1548._4_4_;
              auVar74._0_4_ = fVar45 + fVar45;
              auVar74._4_4_ = fVar55 + fVar55;
              auVar74._8_4_ = fVar56 + fVar56;
              auVar74._12_4_ = fVar28 + fVar28;
              fVar46 = local_1368._0_4_ * fVar81 +
                       local_1348._0_4_ * fVar104 + local_1358._0_4_ * fVar124;
              fVar36 = local_1368._4_4_ * fVar88 +
                       local_1348._4_4_ * fVar106 + local_1358._4_4_ * fVar127;
              fVar37 = local_1368._8_4_ * fVar89 +
                       local_1348._8_4_ * fVar107 + local_1358._8_4_ * fVar129;
              fVar38 = local_1368._12_4_ * fVar90 +
                       local_1348._12_4_ * fVar108 + local_1358._12_4_ * fVar131;
              auVar75 = vrcpps_avx(auVar74);
              fVar28 = auVar75._0_4_;
              auVar85._0_4_ = auVar74._0_4_ * fVar28;
              fVar45 = auVar75._4_4_;
              auVar85._4_4_ = auVar74._4_4_ * fVar45;
              fVar55 = auVar75._8_4_;
              auVar85._8_4_ = auVar74._8_4_ * fVar55;
              fVar56 = auVar75._12_4_;
              auVar85._12_4_ = auVar74._12_4_ * fVar56;
              auVar96._8_4_ = 0x3f800000;
              auVar96._0_8_ = 0x3f8000003f800000;
              auVar96._12_4_ = 0x3f800000;
              auVar75 = vsubps_avx(auVar96,auVar85);
              local_1378._0_4_ = (fVar46 + fVar46) * (fVar28 + fVar28 * auVar75._0_4_);
              local_1378._4_4_ = (fVar36 + fVar36) * (fVar45 + fVar45 * auVar75._4_4_);
              local_1378._8_4_ = (fVar37 + fVar37) * (fVar55 + fVar55 * auVar75._8_4_);
              local_1378._12_4_ = (fVar38 + fVar38) * (fVar56 + fVar56 * auVar75._12_4_);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar79._4_4_ = uVar1;
              auVar79._0_4_ = uVar1;
              auVar79._8_4_ = uVar1;
              auVar79._12_4_ = uVar1;
              auVar75 = vcmpps_avx(auVar79,local_1378,2);
              fVar28 = ray->tfar;
              auVar86._4_4_ = fVar28;
              auVar86._0_4_ = fVar28;
              auVar86._8_4_ = fVar28;
              auVar86._12_4_ = fVar28;
              auVar66 = vcmpps_avx(local_1378,auVar86,2);
              auVar75 = vandps_avx(auVar75,auVar66);
              auVar66 = vcmpps_avx(auVar74,_DAT_01f7aa10,4);
              auVar75 = vandps_avx(auVar66,auVar75);
              auVar66 = vpand_avx(local_1418,local_1428);
              auVar75 = vpslld_avx(auVar75,0x1f);
              auVar75 = vpsrad_avx(auVar75,0x1f);
              local_13a8 = vpand_avx(auVar75,auVar66);
              uVar12 = vmovmskps_avx(local_13a8);
              if (uVar12 != 0) {
                local_1548 = lVar14 + uVar21;
                local_13e8 = local_1528;
                local_13b8 = &local_1549;
                auVar75 = vrcpps_avx(local_13c8);
                fVar28 = auVar75._0_4_;
                auVar33._0_4_ = local_13c8._0_4_ * fVar28;
                fVar45 = auVar75._4_4_;
                auVar33._4_4_ = local_13c8._4_4_ * fVar45;
                fVar55 = auVar75._8_4_;
                auVar33._8_4_ = local_13c8._8_4_ * fVar55;
                fVar56 = auVar75._12_4_;
                auVar33._12_4_ = local_13c8._12_4_ * fVar56;
                auVar43._8_4_ = 0x3f800000;
                auVar43._0_8_ = 0x3f8000003f800000;
                auVar43._12_4_ = 0x3f800000;
                auVar75 = vsubps_avx(auVar43,auVar33);
                auVar26._0_4_ = fVar28 + fVar28 * auVar75._0_4_;
                auVar26._4_4_ = fVar45 + fVar45 * auVar75._4_4_;
                auVar26._8_4_ = fVar55 + fVar55 * auVar75._8_4_;
                auVar26._12_4_ = fVar56 + fVar56 * auVar75._12_4_;
                auVar34._8_4_ = 0x219392ef;
                auVar34._0_8_ = 0x219392ef219392ef;
                auVar34._12_4_ = 0x219392ef;
                auVar75 = vcmpps_avx(_local_1518,auVar34,5);
                auVar75 = vandps_avx(auVar75,auVar26);
                auVar35._0_4_ = local_1528._0_4_ * auVar75._0_4_;
                auVar35._4_4_ = local_1528._4_4_ * auVar75._4_4_;
                auVar35._8_4_ = local_1528._8_4_ * auVar75._8_4_;
                auVar35._12_4_ = local_1528._12_4_ * auVar75._12_4_;
                local_1398 = vminps_avx(auVar35,auVar43);
                auVar27._0_4_ = local_13d8._0_4_ * auVar75._0_4_;
                auVar27._4_4_ = local_13d8._4_4_ * auVar75._4_4_;
                auVar27._8_4_ = local_13d8._8_4_ * auVar75._8_4_;
                auVar27._12_4_ = local_13d8._12_4_ * auVar75._12_4_;
                local_1388 = vminps_avx(auVar27,auVar43);
                uVar11 = (ulong)(uVar12 & 0xff);
                local_1508 = local_1538->scene;
                lVar14 = lVar14 + uVar21;
                pSVar16 = local_1538->scene;
                do {
                  uVar13 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  local_1470 = *(uint *)(lVar14 + 0x90 + uVar13 * 4);
                  pGVar3 = (pSVar16->geometries).items[local_1470].ptr;
                  if ((pGVar3->mask & ray->mask) == 0) {
                    uVar11 = uVar11 ^ 1L << (uVar13 & 0x3f);
                  }
                  else {
                    local_1528._0_8_ = uVar13;
                    local_1518 = (undefined1  [8])uVar11;
                    if ((local_1538->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e5093;
                    local_14e8._0_8_ = local_1538->args;
                    local_14b8._0_8_ = uVar18;
                    local_14a8._0_8_ = puVar17;
                    local_1458.context = local_1538->user;
                    local_1488 = *(undefined4 *)(local_1368 + uVar13 * 4);
                    local_1484 = *(undefined4 *)(local_1358 + uVar13 * 4);
                    local_1480 = *(undefined4 *)(local_1348 + uVar13 * 4);
                    local_147c = *(undefined4 *)(local_1398 + uVar13 * 4);
                    local_1478 = *(undefined4 *)(local_1388 + uVar13 * 4);
                    local_1474 = *(undefined4 *)(local_1548 + 0xa0 + uVar13 * 4);
                    local_146c = (local_1458.context)->instID[0];
                    local_1468 = (local_1458.context)->instPrimID[0];
                    local_14c8._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1378 + uVar13 * 4);
                    local_152c = -1;
                    local_1458.valid = &local_152c;
                    local_1458.geometryUserPtr = pGVar3->userPtr;
                    local_14f8._0_8_ = ray;
                    local_1458.hit = (RTCHitN *)&local_1488;
                    local_1458.N = 1;
                    local_14d8._0_8_ = pGVar3;
                    local_1458.ray = (RTCRayN *)ray;
                    if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar3->occlusionFilterN)(&local_1458), *local_1458.valid != 0)) {
                      ray = (Ray *)local_14f8._0_8_;
                      if ((*(code **)(local_14e8._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_14e8._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_14d8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002e5093:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_14e8._0_8_ + 0x10))(&local_1458);
                      ray = (Ray *)local_14f8._0_8_;
                      if (*local_1458.valid != 0) goto LAB_002e5093;
                    }
                    *(undefined4 *)(local_14f8._0_8_ + 0x20) = local_14c8._0_4_;
                    uVar11 = (ulong)local_1518 ^ 1L << (local_1528._0_8_ & 0x3f);
                    ray = (Ray *)local_14f8._0_8_;
                    puVar17 = (ulong *)local_14a8._0_8_;
                    uVar18 = local_14b8._0_8_;
                  }
                  lVar14 = local_1548;
                  pSVar16 = local_1508;
                } while (uVar11 != 0);
              }
            }
            local_1490 = local_1490 + 1;
            auVar87 = ZEXT3264(local_11f8);
            auVar97 = ZEXT3264(local_1218);
            auVar103 = ZEXT3264(local_1238);
            auVar105 = ZEXT3264(local_1258);
            auVar109 = ZEXT3264(local_1278);
            auVar112 = ZEXT3264(local_1298);
            auVar120 = ZEXT3264(local_12b8);
            auVar62 = ZEXT3264(local_12d8);
            auVar54 = ZEXT3264(local_12f8);
            auVar76 = ZEXT3264(local_1318);
            auVar80 = ZEXT3264(local_1338);
          } while (local_1490 != local_1498);
        }
LAB_002e5083:
      } while (puVar17 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }